

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene-access.cc
# Opt level: O2

bool tinyusdz::tydra::(anonymous_namespace)::
     ToProperty<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>
               (TypedAttribute<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
                *input,Property *output,string *err)

{
  value_type *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RCX;
  bool bVar1;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> pv;
  Attribute attr;
  PrimVar pvar;
  allocator local_919;
  storage_union local_918;
  long local_908;
  optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_> local_8f8;
  string local_8d8;
  undefined1 local_8b8 [96];
  bool local_858;
  vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_> local_830;
  AttrMetas local_818;
  storage_union local_610;
  undefined **local_600;
  undefined1 local_5f8;
  undefined8 local_5f0;
  undefined1 uStack_5e8;
  undefined7 uStack_5e7;
  undefined1 uStack_5e0;
  undefined8 uStack_5df;
  
  Attribute::Attribute((Attribute *)local_8b8);
  local_8b8._32_4_ = Uniform;
  tinyusdz::value::TypeTraits<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
  type_name_abi_cxx11_();
  ::std::__cxx11::string::_M_assign((string *)(local_8b8 + 0x28));
  ::std::__cxx11::string::_M_dispose();
  if (input->_blocked == true) {
    local_858 = true;
  }
  if ((input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (input->_paths).super__Vector_base<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>._M_impl.
      super__Vector_impl_data._M_start) {
    ::std::vector<tinyusdz::Path,_std::allocator<tinyusdz::Path>_>::operator=
              (&local_830,&input->_paths);
  }
  if ((input->_attrib).has_value_ == true) {
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::optional(&local_8f8,&input->_attrib);
    if (local_8f8.has_value_ == true) {
      value = nonstd::optional_lite::
              optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>::value
                        (&local_8f8);
      linb::any::construct<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>const&>
                ((any *)&local_918,value);
      local_600 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
      local_610.dynamic = (void *)0x0;
      local_5f8 = 0;
      local_5f0 = 0;
      uStack_5e8 = 0;
      uStack_5e7 = 0;
      uStack_5e0 = 0;
      uStack_5df = 0;
      linb::any::operator=((any *)&local_610,(any *)&local_918);
      Attribute::set_var((Attribute *)local_8b8,(PrimVar *)&local_610);
      primvar::PrimVar::~PrimVar((PrimVar *)&local_610);
      if (local_908 != 0) {
        (**(code **)(local_908 + 0x20))(&local_918);
      }
    }
    else if (err != (string *)0x0) {
      ::std::__cxx11::string::string
                ((string *)&local_918,"[InternalError] Invalid TypedAttribute<{}> value.",&local_919
                );
      tinyusdz::value::TypeTraits<std::vector<tinyusdz::Token,std::allocator<tinyusdz::Token>>>::
      type_name_abi_cxx11_();
      fmt::format<std::__cxx11::string>((string *)&local_610,(fmt *)&local_918,&local_8d8,in_RCX);
      ::std::__cxx11::string::append((string *)err);
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
      ::std::__cxx11::string::_M_dispose();
    }
    nonstd::optional_lite::optional<std::vector<tinyusdz::Token,_std::allocator<tinyusdz::Token>_>_>
    ::~optional(&local_8f8);
    if (local_8f8.has_value_ == false) {
      bVar1 = false;
      goto LAB_00293b71;
    }
  }
  AttrMetas::operator=(&local_818,&input->_metas);
  Property::Property((Property *)&local_610,(Attribute *)local_8b8,false);
  Property::operator=(output,(Property *)&local_610);
  Property::~Property((Property *)&local_610);
  bVar1 = true;
LAB_00293b71:
  Attribute::~Attribute((Attribute *)local_8b8);
  return bVar1;
}

Assistant:

bool ToProperty(const TypedAttribute<T> &input, Property &output, std::string *err) {

#if 0 // old-code: TODO: Remove
  if (input.is_blocked()) {
    Attribute attr;
    attr.set_blocked(input.is_blocked());
    attr.variability() = Variability::Uniform;
    attr.set_type_name(value::TypeTraits<T>::type_name());
    output = Property(std::move(attr), /*custom*/ false);
  } else if (input.is_value_empty()) {
    // type info only
    output = Property::MakeEmptyAttrib(value::TypeTraits<T>::type_name(),
                                       /* custom */ false);
  } else if (input.is_connection()) {
    // Use Relation for Connection(as typed relationshipTarget)
    // Single connection targetPath only.
    Relationship relTarget;
    std::vector<Path> paths = input.get_connections();
    if (paths.empty()) {
      if (err) {
        (*err) += fmt::format(
            "[InternalError] Connection attribute but empty targetPaths.");
      }
      return false;
    } else if (paths.size() == 1) {
      output = Property(paths[0], /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    } else {
      output = Property(paths, /* type */ value::TypeTraits<T>::type_name(),
                        /* custom */ false);
    }

  } else {
    // Includes !authored()
    if (auto pv = input.get_value()) {
      value::Value val(pv.value());
      primvar::PrimVar pvar;
      pvar.set_value(val);
      Attribute attr;
      attr.set_var(std::move(pvar));
      attr.variability() = Variability::Uniform;
      output = Property(attr, /* custom */ false);
    } else {
      if (err) {
        (*err) +=
            fmt::format("[InternalError] Invalid TypedAttribute<{}> value.",
                        value::TypeTraits<T>::type_name());
      }

      return false;
    }
  }
#else

  Attribute attr;
  attr.variability() = Variability::Uniform;
  attr.set_type_name(value::TypeTraits<T>::type_name());

  if (input.is_blocked()) {
    attr.set_blocked(input.is_blocked());
  }

  if (input.has_connections()) {
    attr.set_connections(input.get_connections());
  }

  if (input.has_value()) {
    // Includes !authored()
    if (auto pv = input.get_value()) {
      value::Value val(pv.value());
      primvar::PrimVar pvar;
      pvar.set_value(val);

      attr.set_var(std::move(pvar));
    } else {
      if (err) {
        (*err) += fmt::format("[InternalError] Invalid TypedAttribute<{}> value.", value::TypeTraits<T>::type_name());
      }

      return false;
    }
  }

  attr.metas() = input.metas();

  output = Property(std::move(attr), /* custom */false);

#endif

  return true;
}